

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu34x_com.c
# Opt level: O3

RK_S32 vdpu34x_set_rcbinfo(MppDev dev,Vdpu34xRcbInfo *rcb_info)

{
  long lVar1;
  MppDevRcbInfoCfg rcb_cfg;
  RK_S32 local_30;
  int local_2c;
  
  lVar1 = 0;
  do {
    if (lVar1 != 0xc) {
      local_30 = rcb_info[*(uint *)((long)&DAT_002c1b90 + lVar1)].reg;
      local_2c = rcb_info[*(uint *)((long)&DAT_002c1b90 + lVar1)].size;
      if (local_2c != 0) {
        mpp_dev_ioctl(dev,8,&local_30);
      }
    }
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x28);
  return 0;
}

Assistant:

RK_S32 vdpu34x_set_rcbinfo(MppDev dev, Vdpu34xRcbInfo *rcb_info)
{
    MppDevRcbInfoCfg rcb_cfg;
    RK_U32 i;
    /*
     * RCB_SET_BY_SIZE_SORT_MODE: by size sort
     * RCB_SET_BY_PRIORITY_MODE: by priority
     */
    Vdpu34xRcbSetMode_e set_rcb_mode = RCB_SET_BY_PRIORITY_MODE;
    RK_U32 rcb_priority[RCB_BUF_COUNT] = {
        RCB_DBLK_ROW,
        RCB_INTRA_ROW,
        RCB_SAO_ROW,
        RCB_INTER_ROW,
        RCB_FBC_ROW,
        RCB_TRANSD_ROW,
        RCB_STRMD_ROW,
        RCB_INTER_COL,
        RCB_FILT_COL,
        RCB_TRANSD_COL,
    };

    switch (set_rcb_mode) {
    case RCB_SET_BY_SIZE_SORT_MODE : {
        Vdpu34xRcbInfo info[RCB_BUF_COUNT];

        memcpy(info, rcb_info, sizeof(info));
        qsort(info, MPP_ARRAY_ELEMS(info),
              sizeof(info[0]), vdpu34x_compare_rcb_size);

        for (i = 0; i < MPP_ARRAY_ELEMS(info); i++) {
            rcb_cfg.reg_idx = info[i].reg;
            rcb_cfg.size = info[i].size;
            if (rcb_cfg.size > 0) {
                mpp_dev_ioctl(dev, MPP_DEV_RCB_INFO, &rcb_cfg);
            } else
                break;
        }
    } break;
    case RCB_SET_BY_PRIORITY_MODE : {
        Vdpu34xRcbInfo *info = rcb_info;
        RK_U32 index = 0;

        for (i = 0; i < MPP_ARRAY_ELEMS(rcb_priority); i ++) {
            index = rcb_priority[i];
            /*
             * If the inter row rcb buffer is placed in sram,
             * may conflict with other buffer in ddr,
             * will result in slower access to data and degraded decoding performance.
             * The issue will be resolved in chips after rk3588.
             */
            if (index == RCB_INTER_ROW)
                continue;

            rcb_cfg.reg_idx = info[index].reg;
            rcb_cfg.size = info[index].size;
            if (rcb_cfg.size > 0) {
                mpp_dev_ioctl(dev, MPP_DEV_RCB_INFO, &rcb_cfg);
            }
        }
    } break;
    default:
        break;
    }

    return 0;
}